

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::AllocateLoopHeaders(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  void *pvVar5;
  undefined4 *puVar6;
  Recycler *this_00;
  char *ptr;
  LoopHeader *this_01;
  char *pcVar7;
  ulong uVar8;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LoopHeaderArray);
  if (pvVar5 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ac2,"(this->GetLoopHeaderArray() == nullptr)",
                                "this->GetLoopHeaderArray() == nullptr");
    if (!bVar2) goto LAB_0076f59e;
    *puVar6 = 0;
  }
  uVar3 = GetCountField(this,LoopCount);
  if (uVar3 != 0) {
    uVar8 = (ulong)uVar3;
    local_50 = (undefined1  [8])&LoopHeader::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x1ac7;
    data.plusSize = uVar8;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0076f59e;
      *puVar6 = 0;
    }
    ptr = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                    (this_00,uVar8 * 0x30);
    if (ptr == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_0076f59e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    pcVar7 = ptr;
    do {
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7[0x20] = '\0';
      pcVar7[0x21] = '\0';
      pcVar7[0x22] = '\0';
      pcVar7[0x23] = '\0';
      pcVar7[0x24] = '\0';
      pcVar7[0x25] = '\0';
      pcVar7[0x26] = '\0';
      pcVar7[0x27] = '\0';
      pcVar7 = pcVar7 + 0x30;
    } while (pcVar7 != ptr + uVar8 * 0x30);
    FunctionProxy::SetAuxPtr((FunctionProxy *)this,LoopHeaderArray,ptr);
    this_01 = (LoopHeader *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,LoopHeaderArray);
    do {
      LoopHeader::Init(this_01,this);
      this_01 = this_01 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

void FunctionBody::AllocateLoopHeaders()
    {
        Assert(this->GetLoopHeaderArray() == nullptr);

        uint loopCount = GetLoopCount();
        if (loopCount != 0)
        {
            this->SetLoopHeaderArray(RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(), LoopHeader, loopCount));
            auto loopHeaderArray = this->GetLoopHeaderArray();
            for (uint i = 0; i < loopCount; i++)
            {
                loopHeaderArray[i].Init(this);
            }
        }
    }